

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_ManPrintStats(Cba_Man_t *p,int nModules,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Cba_Ntk_t *p_00;
  char *pcVar4;
  Cba_Ntk_t *pRoot;
  uint local_28;
  int nUsers;
  int nPrims;
  int i;
  Cba_Ntk_t *pNtk;
  int fVerbose_local;
  int nModules_local;
  Cba_Man_t *p_local;
  
  pNtk._0_4_ = fVerbose;
  pNtk._4_4_ = nModules;
  _fVerbose_local = p;
  p_00 = Cba_ManRoot(p);
  Cba_ManBoxNumRec(_fVerbose_local,(int *)&local_28,(int *)((long)&pRoot + 4));
  pcVar4 = Cba_ManName(_fVerbose_local);
  printf("%-12s : ",pcVar4);
  uVar1 = Cba_NtkPiNum(p_00);
  printf("pi =%5d  ",(ulong)uVar1);
  uVar1 = Cba_NtkPoNum(p_00);
  printf("po =%5d  ",(ulong)uVar1);
  uVar1 = Cba_ManNtkNum(_fVerbose_local);
  printf("mod =%5d  ",(ulong)uVar1);
  printf("box =%5d  ",(ulong)(local_28 + pRoot._4_4_));
  printf("prim =%5d  ",(ulong)local_28);
  printf("user =%5d  ",(ulong)pRoot._4_4_);
  iVar2 = Cba_ManMemory(_fVerbose_local);
  printf("mem =%6.3f MB",((double)iVar2 * 1.0) / 1048576.0);
  printf("\n");
  nUsers = 1;
  while ((iVar2 = nUsers, iVar3 = Cba_ManNtkNum(_fVerbose_local), iVar2 <= iVar3 &&
         (_nPrims = Cba_ManNtk(_fVerbose_local,nUsers), nUsers != pNtk._4_4_ + 1))) {
    printf("Module %5d : ",(ulong)(uint)nUsers);
    Cba_NtkPrintStats(_nPrims);
    nUsers = nUsers + 1;
  }
  return;
}

Assistant:

static inline void Cba_ManPrintStats( Cba_Man_t * p, int nModules, int fVerbose )
{
    Cba_Ntk_t * pNtk; int i, nPrims, nUsers;
    Cba_Ntk_t * pRoot = Cba_ManRoot( p );
    Cba_ManBoxNumRec( p, &nPrims, &nUsers );
    printf( "%-12s : ",     Cba_ManName(p) );
    printf( "pi =%5d  ",    Cba_NtkPiNum(pRoot) );
    printf( "po =%5d  ",    Cba_NtkPoNum(pRoot) );
    printf( "mod =%5d  ",   Cba_ManNtkNum(p) );
    printf( "box =%5d  ",   nPrims + nUsers );
    printf( "prim =%5d  ",  nPrims );
    printf( "user =%5d  ",  nUsers );
    printf( "mem =%6.3f MB", 1.0*Cba_ManMemory(p)/(1<<20) );
    printf( "\n" );
    Cba_ManForEachNtk( p, pNtk, i )
    {
        if ( i == nModules+1 )
            break;
        printf( "Module %5d : ", i );
        Cba_NtkPrintStats( pNtk );
    }
}